

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_lightmap_image_t *
golf_lightmap_image(golf_lightmap_image_t *__return_storage_ptr__,char *name,int resolution,
                   int width,int height,float time_length,_Bool repeats,int num_samples,uchar **data
                   ,sg_image *sg_image)

{
  golf_lightmap_image_t *lightmap;
  _Bool repeats_local;
  float time_length_local;
  int height_local;
  int width_local;
  int resolution_local;
  char *name_local;
  
  __return_storage_ptr__->active = true;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name,height,(ulong)(uint)num_samples);
  __return_storage_ptr__->resolution = resolution;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->time_length = time_length;
  __return_storage_ptr__->repeats = repeats;
  __return_storage_ptr__->edited_num_samples = num_samples;
  __return_storage_ptr__->num_samples = num_samples;
  __return_storage_ptr__->data = data;
  __return_storage_ptr__->sg_image = sg_image;
  return __return_storage_ptr__;
}

Assistant:

golf_lightmap_image_t golf_lightmap_image(const char *name, int resolution, int width, int height, float time_length, bool repeats, int num_samples, unsigned char **data, sg_image *sg_image) {
    golf_lightmap_image_t lightmap;
    lightmap.active = true;
    snprintf(lightmap.name, GOLF_MAX_NAME_LEN, "%s", name);
    lightmap.resolution = resolution;
    lightmap.width = width;
    lightmap.height = height;
    lightmap.time_length = time_length;
    lightmap.repeats = repeats;
    lightmap.edited_num_samples = num_samples;
    lightmap.num_samples = num_samples;
    lightmap.data = data;
    lightmap.sg_image = sg_image;
    return lightmap;
}